

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O0

bool FormatImage(string *path,Range range)

{
  DataRate DVar1;
  bool bVar2;
  int iVar3;
  int def_heads;
  uint uVar4;
  uint uVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  anon_class_16_2_20bd3527 local_118;
  function<void_(const_CylHead_&)> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_84 [8];
  Format fmt;
  undefined1 local_38 [8];
  shared_ptr<Disk> disk;
  string *path_local;
  Range range_local;
  
  range_local._0_8_ = range._8_8_;
  register0x00000030 = range._0_8_;
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  std::make_shared<Disk>();
  bVar2 = ReadImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_38,true);
  if (bVar2) {
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    iVar3 = Disk::cyls(peVar6);
    peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    def_heads = Disk::heads(peVar6);
    ValidateRange((Range *)((long)&path_local + 4),0x80,2,1,iVar3,def_heads);
    Format::Format((Format *)local_84,(uint)(opt.cpm != 0));
    fmt.head0 = 0;
    if (opt.encoding == FM) {
      fmt.datarate = (int)fmt.datarate / 2;
    }
    Format::Override((Format *)local_84,true);
    Format::Validate((Format *)local_84);
    to_string_abi_cxx11_(&local_c8,(DataRate *)&fmt.heads);
    uVar7 = std::__cxx11::string::c_str();
    to_string_abi_cxx11_(&local_e8,&fmt.fdc);
    uVar8 = std::__cxx11::string::c_str();
    uVar4 = Range::cyls((Range *)((long)&path_local + 4));
    uVar5 = Range::heads((Range *)((long)&path_local + 4));
    DVar1 = fmt.datarate;
    iVar3 = Format::sector_size((Format *)local_84);
    util::fmt_abi_cxx11_
              (&local_a8,"%s %s, %2u cyls, %u heads, %2u sectors/track, %4u bytes/sector\n",uVar7,
               uVar8,(ulong)uVar4,(ulong)uVar5,DVar1,iVar3);
    util::operator<<((LogHelper *)&util::cout,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    local_118.fmt = (Format *)local_84;
    local_118.disk = (shared_ptr<Disk> *)local_38;
    std::function<void(CylHead_const&)>::
    function<FormatImage(std::__cxx11::string_const&,Range)::__0,void>
              ((function<void(CylHead_const&)> *)&local_108,&local_118);
    Range::each((Range *)((long)&path_local + 4),&local_108,(bool)(fmt.head1._1_1_ & 1));
    std::function<void_(const_CylHead_&)>::~function(&local_108);
    range_local.head_begin._3_1_ =
         WriteImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_38);
  }
  else {
    range_local.head_begin._3_1_ = false;
  }
  fmt.gap3 = 1;
  std::shared_ptr<Disk>::~shared_ptr((shared_ptr<Disk> *)local_38);
  return (bool)(range_local.head_begin._3_1_ & 1);
}

Assistant:

bool FormatImage(const std::string& path, Range range)
{
    auto disk = std::make_shared<Disk>();
    if (!ReadImage(path, disk))
        return false;

    ValidateRange(range, MAX_TRACKS, MAX_SIDES, 1, disk->cyls(), disk->heads());

    // Start with MGT or ProDos format, but with automatic gap3.
    Format fmt{ !opt.cpm ? RegularFormat::MGT : RegularFormat::ProDos };
    fmt.gap3 = 0;

    // Halve the default sector count in FM to ensure it fits.
    if (opt.encoding == Encoding::FM)
        fmt.sectors /= 2;

    // Allow everything to be overridden, but check it's sensible.
    fmt.Override(true);
    fmt.Validate();

    util::cout <<
        util::fmt("%s %s, %2u cyls, %u heads, %2u sectors/track, %4u bytes/sector\n",
            to_string(fmt.datarate).c_str(), to_string(fmt.encoding).c_str(),
            range.cyls(), range.heads(), fmt.sectors, fmt.sector_size());

    range.each([&](const CylHead& cylhead) {
        Track track;
        track.format(cylhead, fmt);
        Message(msgStatus, "Formatting %s", CH(cylhead.cyl, cylhead.head));
        disk->write(cylhead, std::move(track));
        }, fmt.cyls_first);

    return WriteImage(path, disk);
}